

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O1

void __thiscall
njoy::ENDFtk::file::
Base<njoy::ENDFtk::file::Type<2>,std::variant<njoy::ENDFtk::section::Type<2,151>,njoy::ENDFtk::section::Type<2,152>>>
::Base<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (Base<njoy::ENDFtk::file::Type<2>,std::variant<njoy::ENDFtk::section::Type<2,151>,njoy::ENDFtk::section::Type<2,152>>>
           *this,StructureDivision *division,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *end,long *lineNumber)

{
  long *in_R9;
  
  read<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((map<int,_std::variant<njoy::ENDFtk::section::Type<2,_151>,_njoy::ENDFtk::section::Type<2,_152>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::variant<njoy::ENDFtk::section::Type<2,_151>,_njoy::ENDFtk::section::Type<2,_152>_>_>_>_>
              *)this,(Base<njoy::ENDFtk::file::Type<2>,std::variant<njoy::ENDFtk::section::Type<2,151>,njoy::ENDFtk::section::Type<2,152>>>
                      *)division,(StructureDivision *)begin,end,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)lineNumber,in_R9);
  return;
}

Assistant:

Base( StructureDivision& division,
      Iterator& begin, const Iterator& end, long& lineNumber )
  try: sections_( read( division, begin, end, lineNumber ) ) {}
  catch ( std::exception& e ) {

    Log::info("Encountered error while reading file::Type<{}>", this->MF() );
    Log::info( "Line number: {}", lineNumber );
    throw e;
  }